

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SPIRType * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRType>::allocate<>(ObjectPool<spirv_cross::SPIRType> *this)

{
  size_t sVar1;
  _Tuple_impl<0UL,_spirv_cross::SPIRType_*,_spirv_cross::ObjectPool<spirv_cross::SPIRType>::MallocDeleter>
  _Var2;
  _Head_base<0UL,_spirv_cross::SPIRType_*,_false> _Var3;
  uint uVar4;
  ulong uVar5;
  SPIRType *__s;
  
  if ((this->vacants).super_VectorView<spirv_cross::SPIRType_*>.buffer_size == 0) {
    uVar4 = this->start_object_count <<
            ((byte)(this->memory).
                   super_VectorView<std::unique_ptr<spirv_cross::SPIRType,_spirv_cross::ObjectPool<spirv_cross::SPIRType>::MallocDeleter>_>
                   .buffer_size & 0x1f);
    _Var2.super__Head_base<0UL,_spirv_cross::SPIRType_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRType_*,_false>)malloc((ulong)uVar4 * 0x150);
    if (_Var2.super__Head_base<0UL,_spirv_cross::SPIRType_*,_false>._M_head_impl != (SPIRType *)0x0)
    {
      if (uVar4 != 0) {
        uVar5 = (ulong)uVar4;
        _Var3._M_head_impl =
             (SPIRType *)_Var2.super__Head_base<0UL,_spirv_cross::SPIRType_*,_false>._M_head_impl;
        do {
          SmallVector<spirv_cross::SPIRType_*,_0UL>::reserve
                    (&this->vacants,
                     (this->vacants).super_VectorView<spirv_cross::SPIRType_*>.buffer_size + 1);
          sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRType_*>.buffer_size;
          (this->vacants).super_VectorView<spirv_cross::SPIRType_*>.ptr[sVar1] = _Var3._M_head_impl;
          (this->vacants).super_VectorView<spirv_cross::SPIRType_*>.buffer_size = sVar1 + 1;
          _Var3._M_head_impl = _Var3._M_head_impl + 1;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      SmallVector<std::unique_ptr<spirv_cross::SPIRType,_spirv_cross::ObjectPool<spirv_cross::SPIRType>::MallocDeleter>,_8UL>
      ::reserve(&this->memory,
                (this->memory).
                super_VectorView<std::unique_ptr<spirv_cross::SPIRType,_spirv_cross::ObjectPool<spirv_cross::SPIRType>::MallocDeleter>_>
                .buffer_size + 1);
      sVar1 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRType,_spirv_cross::ObjectPool<spirv_cross::SPIRType>::MallocDeleter>_>
              .buffer_size;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRType,_spirv_cross::ObjectPool<spirv_cross::SPIRType>::MallocDeleter>_>
      .ptr[sVar1]._M_t.
      super___uniq_ptr_impl<spirv_cross::SPIRType,_spirv_cross::ObjectPool<spirv_cross::SPIRType>::MallocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_spirv_cross::SPIRType_*,_spirv_cross::ObjectPool<spirv_cross::SPIRType>::MallocDeleter>
      .super__Head_base<0UL,_spirv_cross::SPIRType_*,_false> =
           _Var2.super__Head_base<0UL,_spirv_cross::SPIRType_*,_false>._M_head_impl;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRType,_spirv_cross::ObjectPool<spirv_cross::SPIRType>::MallocDeleter>_>
      .buffer_size = sVar1 + 1;
      if (_Var2.super__Head_base<0UL,_spirv_cross::SPIRType_*,_false>._M_head_impl !=
          (SPIRType *)0x0) goto LAB_002f84d3;
    }
    __s = (SPIRType *)0x0;
  }
  else {
LAB_002f84d3:
    sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRType_*>.buffer_size;
    __s = (this->vacants).super_VectorView<spirv_cross::SPIRType_*>.ptr[sVar1 - 1];
    if (sVar1 != 0) {
      SmallVector<spirv_cross::SPIRType_*,_0UL>::resize(&this->vacants,sVar1 - 1);
    }
    memset(__s,0,0x150);
    (__s->super_IVariant).self.id = 0;
    (__s->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRType_003d8230;
    *(undefined8 *)&(__s->super_IVariant).field_0xc = 0;
    __s->vecsize = 1;
    __s->columns = 1;
    (__s->array).super_VectorView<unsigned_int>.ptr = (uint *)0x0;
    (__s->array).super_VectorView<unsigned_int>.buffer_size = 0;
    (__s->array).super_VectorView<unsigned_int>.ptr = (uint *)&(__s->array).stack_storage;
    (__s->array).buffer_capacity = 8;
    (__s->array_size_literal).super_VectorView<bool>.ptr = (bool *)0x0;
    (__s->array_size_literal).super_VectorView<bool>.buffer_size = 0;
    (__s->array_size_literal).super_VectorView<bool>.ptr =
         (bool *)&(__s->array_size_literal).stack_storage;
    (__s->array_size_literal).buffer_capacity = 8;
    __s->pointer_depth = 0;
    __s->pointer = false;
    __s->forward_pointer = false;
    __s->storage = StorageClassGeneric;
    (__s->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr =
         (TypedID<(spirv_cross::Types)1> *)0x0;
    (__s->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size =
         0;
    (__s->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr =
         (TypedID<(spirv_cross::Types)1> *)&(__s->member_types).stack_storage;
    (__s->member_types).buffer_capacity = 8;
    (__s->member_type_index_redirection).super_VectorView<unsigned_int>.ptr = (uint *)0x0;
    (__s->member_type_index_redirection).super_VectorView<unsigned_int>.buffer_size = 0;
    (__s->member_type_index_redirection).super_VectorView<unsigned_int>.ptr =
         (uint *)&(__s->member_type_index_redirection).stack_storage;
    (__s->member_type_index_redirection).buffer_capacity = 8;
    (__s->image).type.id = 0;
    __s->type_alias = 0;
    __s->parent_type = 0;
    (__s->member_name_cache)._M_h._M_buckets = &(__s->member_name_cache)._M_h._M_single_bucket;
    (__s->member_name_cache)._M_h._M_bucket_count = 1;
    (__s->member_name_cache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__s->member_name_cache)._M_h._M_element_count = 0;
    (__s->member_name_cache)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (__s->member_name_cache)._M_h._M_rehash_policy._M_next_resize = 0;
    (__s->member_name_cache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  }
  return __s;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}